

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O1

void __thiscall QPDFLogger::warn(QPDFLogger *this,char *s)

{
  QPDFLogger local_20;
  
  getWarn(&local_20,SUB81(this,0));
  Pipeline::writeCStr((Pipeline *)
                      local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,s);
  if (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return;
  }
  return;
}

Assistant:

void
QPDFLogger::warn(char const* s)
{
    getWarn(false)->writeCStr(s);
}